

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::CWriter::ExportName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view export_name)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  string *extraout_RAX;
  string *psVar4;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined1 double_underscores;
  string_view name;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_48,"w2c_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x1f8)
                );
  double_underscores = 0x5f;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_48,local_48._M_string_length,0,'\x01');
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_78 = *puVar5;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *puVar5;
    local_88 = (ulong *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  name._M_str = (char *)0x0;
  name._M_len = (size_t)export_name._M_str;
  Mangle_abi_cxx11_(&local_68,(CWriter *)export_name._M_len,name,(bool)double_underscores);
  uVar6 = 0xf;
  if (local_88 != &local_78) {
    uVar6 = local_78;
  }
  if (uVar6 < local_68._M_string_length + local_80) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar7 = local_68.field_2._M_allocated_capacity;
    }
    if (local_68._M_string_length + local_80 <= (ulong)uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_88);
      goto LAB_00196f1d;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
LAB_00196f1d:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar7 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  psVar4 = (string *)&local_48.field_2;
  if ((string *)local_48._M_dataplus._M_p != psVar4) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

std::string CWriter::ExportName(std::string_view export_name) {
  return kSymbolPrefix + module_prefix_ + '_' + MangleName(export_name);
}